

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>_>::writeValueTo
          (TypedAttribute<Imath_3_2::Vec3<float>_> *this,OStream *os,int version)

{
  OStream *in_RDI;
  float in_stack_ffffffffffffffdc;
  
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

IMF_EXPORT void
V3fAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.x);
    Xdr::write<StreamIO> (os, _value.y);
    Xdr::write<StreamIO> (os, _value.z);
}